

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_md5.c
# Opt level: O2

u_char * ngx_md5_body(ngx_md5_t *ctx,u_char *data,size_t size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint32_t uVar26;
  
  uVar26 = ctx->a;
  uVar22 = ctx->b;
  uVar20 = ctx->c;
  uVar17 = ctx->d;
  do {
    iVar1 = *(int *)data;
    iVar2 = *(int *)((long)data + 4);
    uVar23 = iVar1 + ((uVar20 ^ uVar17) & uVar22 ^ uVar17) + uVar26 + 0xd76aa478;
    uVar24 = (uVar23 * 0x80 | uVar23 >> 0x19) + uVar22;
    uVar23 = ((uVar22 ^ uVar20) & uVar24 ^ uVar20) + uVar17 + iVar2 + 0xe8c7b756;
    uVar23 = (uVar23 * 0x1000 | uVar23 >> 0x14) + uVar24;
    iVar3 = *(int *)((long)data + 8);
    uVar18 = ((uVar24 ^ uVar22) & uVar23 ^ uVar22) + uVar20 + iVar3 + 0x242070db;
    uVar19 = (uVar18 * 0x20000 | uVar18 >> 0xf) + uVar23;
    iVar4 = *(int *)((long)data + 0xc);
    uVar18 = uVar22 + iVar4 + ((uVar23 ^ uVar24) & uVar19 ^ uVar24) + 0xc1bdceee;
    uVar21 = (uVar18 * 0x400000 | uVar18 >> 10) + uVar19;
    iVar5 = *(int *)((long)data + 0x10);
    uVar18 = ((uVar19 ^ uVar23) & uVar21 ^ uVar23) + uVar24 + iVar5 + 0xf57c0faf;
    uVar18 = (uVar18 * 0x80 | uVar18 >> 0x19) + uVar21;
    iVar6 = *(int *)((long)data + 0x14);
    uVar23 = uVar23 + iVar6 + ((uVar21 ^ uVar19) & uVar18 ^ uVar19) + 0x4787c62a;
    uVar23 = (uVar23 * 0x1000 | uVar23 >> 0x14) + uVar18;
    iVar7 = *(int *)((long)data + 0x18);
    uVar19 = uVar19 + iVar7 + ((uVar18 ^ uVar21) & uVar23 ^ uVar21) + 0xa8304613;
    uVar19 = (uVar19 * 0x20000 | uVar19 >> 0xf) + uVar23;
    iVar8 = *(int *)((long)data + 0x1c);
    uVar21 = uVar21 + iVar8 + ((uVar23 ^ uVar18) & uVar19 ^ uVar18) + 0xfd469501;
    uVar21 = (uVar21 * 0x400000 | uVar21 >> 10) + uVar19;
    iVar9 = *(int *)((long)data + 0x20);
    uVar18 = uVar18 + iVar9 + ((uVar19 ^ uVar23) & uVar21 ^ uVar23) + 0x698098d8;
    uVar18 = (uVar18 * 0x80 | uVar18 >> 0x19) + uVar21;
    iVar10 = *(int *)((long)data + 0x24);
    uVar23 = uVar23 + iVar10 + ((uVar21 ^ uVar19) & uVar18 ^ uVar19) + 0x8b44f7af;
    uVar23 = (uVar23 * 0x1000 | uVar23 >> 0x14) + uVar18;
    iVar11 = *(int *)((long)data + 0x28);
    uVar19 = (((uVar18 ^ uVar21) & uVar23 ^ uVar21) + uVar19 + iVar11) - 0xa44f;
    uVar24 = (uVar19 * 0x20000 | uVar19 >> 0xf) + uVar23;
    iVar12 = *(int *)((long)data + 0x2c);
    uVar19 = ((uVar23 ^ uVar18) & uVar24 ^ uVar18) + uVar21 + iVar12 + 0x895cd7be;
    uVar19 = (uVar19 * 0x400000 | uVar19 >> 10) + uVar24;
    iVar13 = *(int *)((long)data + 0x30);
    uVar18 = ((uVar24 ^ uVar23) & uVar19 ^ uVar23) + uVar18 + iVar13 + 0x6b901122;
    uVar18 = (uVar18 * 0x80 | uVar18 >> 0x19) + uVar19;
    iVar14 = *(int *)((long)data + 0x34);
    uVar23 = uVar23 + iVar14 + ((uVar19 ^ uVar24) & uVar18 ^ uVar24) + 0xfd987193;
    uVar23 = (uVar23 * 0x1000 | uVar23 >> 0x14) + uVar18;
    iVar15 = *(int *)((long)data + 0x38);
    uVar21 = uVar24 + iVar15 + ((uVar18 ^ uVar19) & uVar23 ^ uVar19) + 0xa679438e;
    uVar24 = (uVar21 * 0x20000 | uVar21 >> 0xf) + uVar23;
    iVar16 = *(int *)((long)data + 0x3c);
    uVar19 = ((uVar23 ^ uVar18) & uVar24 ^ uVar18) + uVar19 + iVar16 + 0x49b40821;
    uVar21 = (uVar19 * 0x400000 | uVar19 >> 10) + uVar24;
    uVar18 = ((uVar21 ^ uVar24) & uVar23 ^ uVar24) + uVar18 + iVar2 + 0xf61e2562;
    uVar18 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar21;
    uVar23 = ((uVar18 ^ uVar21) & uVar24 ^ uVar21) + uVar23 + iVar7 + 0xc040b340;
    uVar19 = (uVar23 * 0x200 | uVar23 >> 0x17) + uVar18;
    uVar23 = uVar24 + iVar12 + ((uVar19 ^ uVar18) & uVar21 ^ uVar18) + 0x265e5a51;
    uVar24 = (uVar23 * 0x4000 | uVar23 >> 0x12) + uVar19;
    uVar23 = ((uVar24 ^ uVar19) & uVar18 ^ uVar19) + uVar21 + iVar1 + 0xe9b6c7aa;
    uVar23 = (uVar23 * 0x100000 | uVar23 >> 0xc) + uVar24;
    uVar18 = ((uVar23 ^ uVar24) & uVar19 ^ uVar24) + uVar18 + iVar6 + 0xd62f105d;
    uVar21 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar23;
    uVar18 = ((uVar21 ^ uVar23) & uVar24 ^ uVar23) + uVar19 + iVar11 + 0x2441453;
    uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar21;
    uVar19 = uVar24 + iVar16 + ((uVar18 ^ uVar21) & uVar23 ^ uVar21) + 0xd8a1e681;
    uVar24 = (uVar19 * 0x4000 | uVar19 >> 0x12) + uVar18;
    uVar23 = ((uVar24 ^ uVar18) & uVar21 ^ uVar18) + uVar23 + iVar5 + 0xe7d3fbc8;
    uVar19 = (uVar23 * 0x100000 | uVar23 >> 0xc) + uVar24;
    uVar23 = uVar21 + iVar10 + ((uVar19 ^ uVar24) & uVar18 ^ uVar24) + 0x21e1cde6;
    uVar21 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar19;
    uVar23 = ((uVar21 ^ uVar19) & uVar24 ^ uVar19) + uVar18 + iVar15 + 0xc33707d6;
    uVar23 = (uVar23 * 0x200 | uVar23 >> 0x17) + uVar21;
    uVar18 = uVar24 + iVar4 + ((uVar23 ^ uVar21) & uVar19 ^ uVar21) + 0xf4d50d87;
    uVar24 = (uVar18 * 0x4000 | uVar18 >> 0x12) + uVar23;
    uVar18 = ((uVar24 ^ uVar23) & uVar21 ^ uVar23) + uVar19 + iVar9 + 0x455a14ed;
    uVar19 = (uVar18 * 0x100000 | uVar18 >> 0xc) + uVar24;
    uVar18 = uVar21 + iVar14 + ((uVar19 ^ uVar24) & uVar23 ^ uVar24) + 0xa9e3e905;
    uVar21 = (uVar18 * 0x20 | uVar18 >> 0x1b) + uVar19;
    uVar23 = uVar23 + iVar3 + ((uVar21 ^ uVar19) & uVar24 ^ uVar19) + 0xfcefa3f8;
    uVar23 = (uVar23 * 0x200 | uVar23 >> 0x17) + uVar21;
    uVar18 = uVar24 + iVar8 + ((uVar23 ^ uVar21) & uVar19 ^ uVar21) + 0x676f02d9;
    uVar18 = (uVar18 * 0x4000 | uVar18 >> 0x12) + uVar23;
    uVar19 = uVar19 + iVar13 + ((uVar18 ^ uVar23) & uVar21 ^ uVar23) + 0x8d2a4c8a;
    uVar19 = (uVar19 * 0x100000 | uVar19 >> 0xc) + uVar18;
    uVar21 = (uVar21 + iVar6 + (uVar18 ^ uVar23 ^ uVar19)) - 0x5c6be;
    uVar21 = (uVar21 * 0x10 | uVar21 >> 0x1c) + uVar19;
    uVar23 = uVar23 + iVar9 + (uVar19 ^ uVar18 ^ uVar21) + 0x8771f681;
    uVar23 = (uVar23 * 0x800 | uVar23 >> 0x15) + uVar21;
    uVar18 = (uVar21 ^ uVar19 ^ uVar23) + uVar18 + iVar12 + 0x6d9d6122;
    uVar24 = (uVar18 * 0x10000 | uVar18 >> 0x10) + uVar23;
    uVar18 = uVar19 + iVar15 + (uVar23 ^ uVar21 ^ uVar24) + 0xfde5380c;
    uVar18 = (uVar18 * 0x800000 | uVar18 >> 9) + uVar24;
    uVar19 = uVar21 + iVar2 + (uVar24 ^ uVar23 ^ uVar18) + 0xa4beea44;
    uVar19 = (uVar19 * 0x10 | uVar19 >> 0x1c) + uVar18;
    uVar23 = uVar23 + iVar5 + (uVar18 ^ uVar24 ^ uVar19) + 0x4bdecfa9;
    uVar23 = (uVar23 * 0x800 | uVar23 >> 0x15) + uVar19;
    uVar21 = uVar24 + iVar8 + (uVar19 ^ uVar18 ^ uVar23) + 0xf6bb4b60;
    uVar21 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar23;
    uVar18 = uVar18 + iVar11 + (uVar23 ^ uVar19 ^ uVar21) + 0xbebfbc70;
    uVar18 = (uVar18 * 0x800000 | uVar18 >> 9) + uVar21;
    uVar19 = uVar19 + iVar14 + (uVar21 ^ uVar23 ^ uVar18) + 0x289b7ec6;
    uVar19 = (uVar19 * 0x10 | uVar19 >> 0x1c) + uVar18;
    uVar23 = uVar23 + iVar1 + (uVar18 ^ uVar21 ^ uVar19) + 0xeaa127fa;
    uVar23 = (uVar23 * 0x800 | uVar23 >> 0x15) + uVar19;
    uVar21 = uVar21 + iVar4 + (uVar19 ^ uVar18 ^ uVar23) + 0xd4ef3085;
    uVar24 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar23;
    uVar18 = (uVar23 ^ uVar19 ^ uVar24) + uVar18 + iVar7 + 0x4881d05;
    uVar18 = (uVar18 * 0x800000 | uVar18 >> 9) + uVar24;
    uVar19 = uVar19 + iVar10 + (uVar24 ^ uVar23 ^ uVar18) + 0xd9d4d039;
    uVar19 = (uVar19 * 0x10 | uVar19 >> 0x1c) + uVar18;
    uVar23 = (uVar18 ^ uVar24 ^ uVar19) + uVar23 + iVar13 + 0xe6db99e5;
    uVar21 = (uVar23 * 0x800 | uVar23 >> 0x15) + uVar19;
    uVar23 = uVar24 + iVar16 + (uVar19 ^ uVar18 ^ uVar21) + 0x1fa27cf8;
    uVar24 = (uVar23 * 0x10000 | uVar23 >> 0x10) + uVar21;
    uVar23 = (uVar21 ^ uVar19 ^ uVar24) + uVar18 + iVar3 + 0xc4ac5665;
    uVar23 = (uVar23 * 0x800000 | uVar23 >> 9) + uVar24;
    uVar18 = ((~uVar21 | uVar23) ^ uVar24) + uVar19 + iVar1 + 0xf4292244;
    uVar19 = (uVar18 * 0x40 | uVar18 >> 0x1a) + uVar23;
    uVar18 = ((~uVar24 | uVar19) ^ uVar23) + uVar21 + iVar8 + 0x432aff97;
    uVar21 = (uVar18 * 0x400 | uVar18 >> 0x16) + uVar19;
    uVar18 = ((~uVar23 | uVar21) ^ uVar19) + uVar24 + iVar15 + 0xab9423a7;
    uVar18 = (uVar18 * 0x8000 | uVar18 >> 0x11) + uVar21;
    uVar23 = uVar23 + iVar6 + ((~uVar19 | uVar18) ^ uVar21) + 0xfc93a039;
    uVar23 = (uVar23 * 0x200000 | uVar23 >> 0xb) + uVar18;
    uVar19 = ((~uVar21 | uVar23) ^ uVar18) + uVar19 + iVar13 + 0x655b59c3;
    uVar19 = (uVar19 * 0x40 | uVar19 >> 0x1a) + uVar23;
    uVar21 = uVar21 + iVar4 + ((~uVar18 | uVar19) ^ uVar23) + 0x8f0ccc92;
    uVar21 = (uVar21 * 0x400 | uVar21 >> 0x16) + uVar19;
    uVar18 = (uVar18 + iVar11 + ((~uVar23 | uVar21) ^ uVar19)) - 0x100b83;
    uVar18 = (uVar18 * 0x8000 | uVar18 >> 0x11) + uVar21;
    uVar23 = uVar23 + iVar2 + ((~uVar19 | uVar18) ^ uVar21) + 0x85845dd1;
    uVar23 = (uVar23 * 0x200000 | uVar23 >> 0xb) + uVar18;
    uVar19 = uVar19 + iVar9 + ((~uVar21 | uVar23) ^ uVar18) + 0x6fa87e4f;
    uVar19 = (uVar19 * 0x40 | uVar19 >> 0x1a) + uVar23;
    uVar21 = uVar21 + iVar16 + ((~uVar18 | uVar19) ^ uVar23) + 0xfe2ce6e0;
    uVar21 = (uVar21 * 0x400 | uVar21 >> 0x16) + uVar19;
    uVar18 = ((~uVar23 | uVar21) ^ uVar19) + uVar18 + iVar7 + 0xa3014314;
    uVar18 = (uVar18 * 0x8000 | uVar18 >> 0x11) + uVar21;
    uVar23 = ((~uVar19 | uVar18) ^ uVar21) + uVar23 + iVar14 + 0x4e0811a1;
    uVar24 = (uVar23 * 0x200000 | uVar23 >> 0xb) + uVar18;
    uVar23 = ((~uVar21 | uVar24) ^ uVar18) + uVar19 + iVar5 + 0xf7537e82;
    uVar25 = (uVar23 * 0x40 | uVar23 >> 0x1a) + uVar24;
    uVar23 = ((~uVar18 | uVar25) ^ uVar24) + uVar21 + iVar12 + 0xbd3af235;
    uVar23 = (uVar23 * 0x400 | uVar23 >> 0x16) + uVar25;
    uVar18 = ((~uVar24 | uVar23) ^ uVar25) + uVar18 + iVar3 + 0x2ad7d2bb;
    uVar18 = (uVar18 * 0x8000 | uVar18 >> 0x11) + uVar23;
    uVar19 = ((~uVar25 | uVar18) ^ uVar23) + uVar24 + iVar10 + 0xeb86d391;
    uVar26 = uVar25 + uVar26;
    uVar22 = uVar22 + uVar18 + (uVar19 * 0x200000 | uVar19 >> 0xb);
    uVar20 = uVar18 + uVar20;
    uVar17 = uVar23 + uVar17;
    data = (u_char *)((long)data + 0x40);
    size = size - 0x40;
  } while (size != 0);
  ctx->a = uVar26;
  ctx->b = uVar22;
  ctx->c = uVar20;
  ctx->d = uVar17;
  return data;
}

Assistant:

static const u_char *
ngx_md5_body(ngx_md5_t *ctx, const u_char *data, size_t size)
{
    uint32_t       a, b, c, d;
    uint32_t       saved_a, saved_b, saved_c, saved_d;
    const u_char  *p;
#if !(NGX_HAVE_LITTLE_ENDIAN && NGX_HAVE_NONALIGNED)
    uint32_t       block[16];
#endif

    p = data;

    a = ctx->a;
    b = ctx->b;
    c = ctx->c;
    d = ctx->d;

    do {
        saved_a = a;
        saved_b = b;
        saved_c = c;
        saved_d = d;

        /* Round 1 */

        STEP(F, a, b, c, d, SET(0),  0xd76aa478, 7);
        STEP(F, d, a, b, c, SET(1),  0xe8c7b756, 12);
        STEP(F, c, d, a, b, SET(2),  0x242070db, 17);
        STEP(F, b, c, d, a, SET(3),  0xc1bdceee, 22);
        STEP(F, a, b, c, d, SET(4),  0xf57c0faf, 7);
        STEP(F, d, a, b, c, SET(5),  0x4787c62a, 12);
        STEP(F, c, d, a, b, SET(6),  0xa8304613, 17);
        STEP(F, b, c, d, a, SET(7),  0xfd469501, 22);
        STEP(F, a, b, c, d, SET(8),  0x698098d8, 7);
        STEP(F, d, a, b, c, SET(9),  0x8b44f7af, 12);
        STEP(F, c, d, a, b, SET(10), 0xffff5bb1, 17);
        STEP(F, b, c, d, a, SET(11), 0x895cd7be, 22);
        STEP(F, a, b, c, d, SET(12), 0x6b901122, 7);
        STEP(F, d, a, b, c, SET(13), 0xfd987193, 12);
        STEP(F, c, d, a, b, SET(14), 0xa679438e, 17);
        STEP(F, b, c, d, a, SET(15), 0x49b40821, 22);

        /* Round 2 */

        STEP(G, a, b, c, d, GET(1),  0xf61e2562, 5);
        STEP(G, d, a, b, c, GET(6),  0xc040b340, 9);
        STEP(G, c, d, a, b, GET(11), 0x265e5a51, 14);
        STEP(G, b, c, d, a, GET(0),  0xe9b6c7aa, 20);
        STEP(G, a, b, c, d, GET(5),  0xd62f105d, 5);
        STEP(G, d, a, b, c, GET(10), 0x02441453, 9);
        STEP(G, c, d, a, b, GET(15), 0xd8a1e681, 14);
        STEP(G, b, c, d, a, GET(4),  0xe7d3fbc8, 20);
        STEP(G, a, b, c, d, GET(9),  0x21e1cde6, 5);
        STEP(G, d, a, b, c, GET(14), 0xc33707d6, 9);
        STEP(G, c, d, a, b, GET(3),  0xf4d50d87, 14);
        STEP(G, b, c, d, a, GET(8),  0x455a14ed, 20);
        STEP(G, a, b, c, d, GET(13), 0xa9e3e905, 5);
        STEP(G, d, a, b, c, GET(2),  0xfcefa3f8, 9);
        STEP(G, c, d, a, b, GET(7),  0x676f02d9, 14);
        STEP(G, b, c, d, a, GET(12), 0x8d2a4c8a, 20);

        /* Round 3 */

        STEP(H, a, b, c, d, GET(5),  0xfffa3942, 4);
        STEP(H, d, a, b, c, GET(8),  0x8771f681, 11);
        STEP(H, c, d, a, b, GET(11), 0x6d9d6122, 16);
        STEP(H, b, c, d, a, GET(14), 0xfde5380c, 23);
        STEP(H, a, b, c, d, GET(1),  0xa4beea44, 4);
        STEP(H, d, a, b, c, GET(4),  0x4bdecfa9, 11);
        STEP(H, c, d, a, b, GET(7),  0xf6bb4b60, 16);
        STEP(H, b, c, d, a, GET(10), 0xbebfbc70, 23);
        STEP(H, a, b, c, d, GET(13), 0x289b7ec6, 4);
        STEP(H, d, a, b, c, GET(0),  0xeaa127fa, 11);
        STEP(H, c, d, a, b, GET(3),  0xd4ef3085, 16);
        STEP(H, b, c, d, a, GET(6),  0x04881d05, 23);
        STEP(H, a, b, c, d, GET(9),  0xd9d4d039, 4);
        STEP(H, d, a, b, c, GET(12), 0xe6db99e5, 11);
        STEP(H, c, d, a, b, GET(15), 0x1fa27cf8, 16);
        STEP(H, b, c, d, a, GET(2),  0xc4ac5665, 23);

        /* Round 4 */

        STEP(I, a, b, c, d, GET(0),  0xf4292244, 6);
        STEP(I, d, a, b, c, GET(7),  0x432aff97, 10);
        STEP(I, c, d, a, b, GET(14), 0xab9423a7, 15);
        STEP(I, b, c, d, a, GET(5),  0xfc93a039, 21);
        STEP(I, a, b, c, d, GET(12), 0x655b59c3, 6);
        STEP(I, d, a, b, c, GET(3),  0x8f0ccc92, 10);
        STEP(I, c, d, a, b, GET(10), 0xffeff47d, 15);
        STEP(I, b, c, d, a, GET(1),  0x85845dd1, 21);
        STEP(I, a, b, c, d, GET(8),  0x6fa87e4f, 6);
        STEP(I, d, a, b, c, GET(15), 0xfe2ce6e0, 10);
        STEP(I, c, d, a, b, GET(6),  0xa3014314, 15);
        STEP(I, b, c, d, a, GET(13), 0x4e0811a1, 21);
        STEP(I, a, b, c, d, GET(4),  0xf7537e82, 6);
        STEP(I, d, a, b, c, GET(11), 0xbd3af235, 10);
        STEP(I, c, d, a, b, GET(2),  0x2ad7d2bb, 15);
        STEP(I, b, c, d, a, GET(9),  0xeb86d391, 21);

        a += saved_a;
        b += saved_b;
        c += saved_c;
        d += saved_d;

        p += 64;

    } while (size -= 64);

    ctx->a = a;
    ctx->b = b;
    ctx->c = c;
    ctx->d = d;

    return p;
}